

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O3

Am_Wrapper * return_move_inter_proc(Am_Object *self)

{
  bool bVar1;
  Am_Wrapper *pAVar2;
  Am_Object mover;
  Am_Object local_18;
  Am_Object local_10;
  
  local_18.data = (Am_Object_Data *)0x0;
  Am_Object::Get_Sibling(&local_10,(Am_Slot_Key)self,0x1da);
  Am_Object::operator=(&local_18,&local_10);
  Am_Object::~Am_Object(&local_10);
  bVar1 = Am_Object::Valid(&local_18);
  if (bVar1) {
    pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&local_18);
  }
  else {
    pAVar2 = (Am_Wrapper *)0x0;
  }
  Am_Object::~Am_Object(&local_18);
  return pAVar2;
}

Assistant:

Am_Define_Value_List_Formula(return_move_inter)
{
  Am_Object mover;
  mover = self.Get_Sibling(Am_MOVE_INTERACTOR);
  if (mover.Valid())
    return mover;
  else
    return nullptr;
}